

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void int_trp_fatal(int line,char *file,char *format,...)

{
  __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this;
  TestResponseProxy *this_00;
  int line_00;
  char *pcVar1;
  allocator<char> *__a;
  uint szbuf_00;
  void *__format;
  char in_AL;
  bool bVar2;
  __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> **__s;
  element_type *this_01;
  undefined8 in_RCX;
  ulong __maxlen;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_178;
  TestResponseProxy *local_170;
  int local_164;
  char *local_160;
  char *local_158;
  allocator<char> *local_150;
  undefined1 local_148 [24];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  allocator<char> local_79;
  string local_78;
  shared_ptr<trun::TestModule> local_58;
  int local_48;
  uint local_44;
  int res;
  uint32_t szbuf;
  char *newstr;
  va_list values;
  char *format_local;
  char *file_local;
  int line_local;
  
  __s = &local_178;
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  local_44 = 0x400;
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  values[0].reg_save_area = format;
  do {
    __format = values[0].reg_save_area;
    __s = (__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> **)
          ((long)__s + -((ulong)local_44 + 0xf & 0xfffffffffffffff0));
    values[0].overflow_arg_area = local_148;
    values[0]._0_8_ = &stack0x00000008;
    newstr._4_4_ = 0x30;
    newstr._0_4_ = 0x18;
    __maxlen = (ulong)local_44;
    _res = (char *)__s;
    *(char *)((long)__s + -8) = -0x76;
    *(char *)((long)__s + -7) = -0x1b;
    *(char *)((long)__s + -6) = '\x12';
    *(char *)((long)__s + -5) = '\0';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    local_48 = vsnprintf((char *)__s,__maxlen,(char *)__format,&newstr);
    if (local_48 < 0) {
      local_44 = local_44 + 0x400;
    }
    szbuf_00 = local_44;
    *(char *)((long)__s + -8) = -0x56;
    *(char *)((long)__s + -7) = -0x1b;
    *(char *)((long)__s + -6) = '\x12';
    *(char *)((long)__s + -5) = '\0';
    *(char *)((long)__s + -4) = '\0';
    *(char *)((long)__s + -3) = '\0';
    *(char *)((long)__s + -2) = '\0';
    *(char *)((long)__s + -1) = '\0';
    bVar2 = IsMsgSizeOk(szbuf_00);
  } while ((bVar2) && (local_48 < 0));
  local_178 = (__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              &local_58;
  *(char *)((long)__s + -8) = -0x34;
  *(char *)((long)__s + -7) = -0x1b;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  trun::TestRunner::GetCurrentTestModule();
  this = local_178;
  *(char *)((long)__s + -8) = -0x28;
  *(char *)((long)__s + -7) = -0x1b;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  this_01 = std::__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->(this);
  *(char *)((long)__s + -8) = -0x20;
  *(char *)((long)__s + -7) = -0x1b;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  local_170 = trun::TestModule::GetTestResponseProxy(this_01);
  local_158 = _res;
  local_150 = &local_79;
  local_164 = line;
  local_160 = file;
  *(char *)((long)__s + -8) = '\x16';
  *(char *)((long)__s + -7) = -0x1a;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  std::allocator<char>::allocator();
  __a = local_150;
  pcVar1 = local_158;
  *(char *)((long)__s + -8) = '-';
  *(char *)((long)__s + -7) = -0x1a;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,__a);
  pcVar1 = local_160;
  line_00 = local_164;
  this_00 = local_170;
  *(char *)((long)__s + -8) = 'L';
  *(char *)((long)__s + -7) = -0x1a;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  trun::TestResponseProxy::Fatal(this_00,line_00,pcVar1,&local_78);
  *(char *)((long)__s + -8) = 'W';
  *(char *)((long)__s + -7) = -0x1a;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  std::__cxx11::string::~string((string *)&local_78);
  *(char *)((long)__s + -8) = '`';
  *(char *)((long)__s + -7) = -0x1a;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  std::allocator<char>::~allocator(&local_79);
  *(char *)((long)__s + -8) = 'i';
  *(char *)((long)__s + -7) = -0x1a;
  *(char *)((long)__s + -6) = '\x12';
  *(char *)((long)__s + -5) = '\0';
  *(char *)((long)__s + -4) = '\0';
  *(char *)((long)__s + -3) = '\0';
  *(char *)((long)__s + -2) = '\0';
  *(char *)((long)__s + -1) = '\0';
  std::shared_ptr<trun::TestModule>::~shared_ptr(&local_58);
  return;
}

Assistant:

static void int_trp_fatal(int line, const char *file, const char *format, ...) {
    CREATE_REPORT_STRING()
    TestRunner::GetCurrentTestModule()->GetTestResponseProxy().Fatal(line, file, std::string(newstr));
}